

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O2

bool __thiscall
cmListFileParser::ParseString(cmListFileParser *this,char *str,char *virtual_filename)

{
  bool bVar1;
  int iVar2;
  allocator<char> local_31;
  string local_30;
  
  this->FileName = virtual_filename;
  iVar2 = cmListFileLexer_SetString(this->Lexer,str);
  if (iVar2 != 0) {
    bVar1 = Parse(this);
    return bVar1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"cmListFileCache: cannot allocate buffer.",&local_31);
  IssueFileOpenError(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return false;
}

Assistant:

bool cmListFileParser::ParseString(const char* str,
                                   const char* virtual_filename)
{
  this->FileName = virtual_filename;

  if (!cmListFileLexer_SetString(this->Lexer, str)) {
    this->IssueFileOpenError("cmListFileCache: cannot allocate buffer.");
    return false;
  }

  return this->Parse();
}